

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_clone(secp256k1_context *ctx)

{
  size_t size;
  void *prealloc;
  secp256k1_context *psVar1;
  size_t prealloc_size;
  secp256k1_context *ret;
  secp256k1_context *ctx_local;
  
  size = secp256k1_context_preallocated_clone_size(ctx);
  prealloc = checked_malloc(&ctx->error_callback,size);
  psVar1 = secp256k1_context_preallocated_clone(ctx,prealloc);
  return psVar1;
}

Assistant:

secp256k1_context* secp256k1_context_clone(const secp256k1_context* ctx) {
    secp256k1_context* ret;
    size_t prealloc_size;

    VERIFY_CHECK(ctx != NULL);
    prealloc_size = secp256k1_context_preallocated_clone_size(ctx);
    ret = (secp256k1_context*)checked_malloc(&ctx->error_callback, prealloc_size);
    ret = secp256k1_context_preallocated_clone(ctx, ret);
    return ret;
}